

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Chapter::Display::Clear(Display *this)

{
  char **unaff_retaddr;
  char *in_stack_00000008;
  
  anon_unknown_12::StrCpy(in_stack_00000008,unaff_retaddr);
  anon_unknown_12::StrCpy(in_stack_00000008,unaff_retaddr);
  anon_unknown_12::StrCpy(in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

void Chapter::Display::Clear() {
  StrCpy(NULL, &title_);
  StrCpy(NULL, &language_);
  StrCpy(NULL, &country_);
}